

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

int __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::ClassId
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_489;
  string local_488;
  TPZDohrSubstructCondense<double> local_468;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"TPZDohrPrecond",&local_489);
  uVar1 = Hash(&local_488);
  iVar2 = TPZMatrix<double>::ClassId(&this->super_TPZMatrix<double>);
  TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(&local_468);
  iVar3 = TPZDohrSubstructCondense<double>::ClassId(&local_468);
  TPZDohrSubstructCondense<double>::~TPZDohrSubstructCondense(&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZDohrPrecond<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrPrecond") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}